

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void instruct_totype(Proc *proc,Pseudo *target,VariableType *vtype,uint line_number)

{
  ravitype_t rVar1;
  uint uVar2;
  C_MemoryAllocator *pCVar3;
  bool bVar4;
  undefined1 *ptr;
  Constant *pCVar5;
  uint *ptr_00;
  undefined1 uVar6;
  Constant local_40;
  
  rVar1 = vtype->type_code;
  if (rVar1 < RAVI_TTABLE) {
    if (rVar1 < RAVI_TARRAYINT) {
      if (rVar1 == RAVI_TNUMINT) {
        uVar6 = 0x30;
      }
      else {
        if (rVar1 != RAVI_TNUMFLT) {
          return;
        }
        uVar6 = 0x31;
      }
    }
    else if (rVar1 == RAVI_TARRAYINT) {
      uVar6 = 0x34;
    }
    else {
      if (rVar1 != RAVI_TARRAYFLT) {
        return;
      }
      uVar6 = 0x35;
    }
  }
  else if (rVar1 < RAVI_TFUNCTION) {
    if (rVar1 == RAVI_TTABLE) {
      uVar6 = 0x36;
    }
    else {
      if (rVar1 != RAVI_TSTRING) {
        return;
      }
      uVar6 = 0x33;
    }
  }
  else {
    if (rVar1 != RAVI_TFUNCTION) {
      if (rVar1 != RAVI_TUSERDATA) {
        return;
      }
      uVar6 = 0x37;
      bVar4 = true;
      goto LAB_00119235;
    }
    uVar6 = 0x32;
  }
  bVar4 = false;
LAB_00119235:
  pCVar3 = proc->linearizer->compiler_state->allocator;
  ptr = (undefined1 *)(*pCVar3->calloc)(pCVar3->arena,1,0x28);
  *ptr = uVar6;
  *(uint *)(ptr + 0x20) = line_number;
  if (bVar4) {
    local_40.field_2 = (anon_union_8_3_4e90b7ae_for_Constant_2)vtype->type_name;
    if ((StringObject *)local_40.field_2.i == (StringObject *)0x0) {
      __assert_fail("vtype->type_name",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x2c9,
                    "void instruct_totype(Proc *, Pseudo *, const VariableType *, unsigned int)");
    }
    local_40.type = 0x101;
    local_40.index = 0;
    pCVar5 = add_constant(proc,&local_40);
    pCVar3 = proc->linearizer->compiler_state->allocator;
    ptr_00 = (uint *)(*pCVar3->calloc)(pCVar3->arena,1,0x30);
    uVar2 = *ptr_00;
    *ptr_00 = uVar2 & 0xfffffff0 | 5;
    *(Constant **)(ptr_00 + 2) = pCVar5;
    *ptr_00 = uVar2 & 0xfff00000 | 5 | (uint)pCVar5->index << 4;
    raviX_ptrlist_add((PtrList **)(ptr + 8),ptr_00,proc->linearizer->compiler_state->allocator);
  }
  if (((undefined1  [48])*target & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),target,proc->linearizer->compiler_state->allocator);
    if ((*(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) &&
       (*(BasicBlock **)(ptr + 0x18) != proc->current_bb)) {
      __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x1b1,"void add_instruction(Proc *, Instruction *)");
    }
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
    return;
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static void instruct_totype(Proc *proc, Pseudo *target, const VariableType *vtype, unsigned line_number)
{
	enum opcode targetop = op_nop;
	switch (vtype->type_code) {
	case RAVI_TNUMFLT:
		targetop = op_toflt;
		break;
	case RAVI_TNUMINT:
		targetop = op_toint;
		break;
	case RAVI_TSTRING:
		targetop = op_tostring;
		break;
	case RAVI_TFUNCTION:
		targetop = op_toclosure;
		break;
	case RAVI_TTABLE:
		targetop = op_totable;
		break;
	case RAVI_TARRAYFLT:
		targetop = op_tofarray;
		break;
	case RAVI_TARRAYINT:
		targetop = op_toiarray;
		break;
	case RAVI_TUSERDATA:
		targetop = op_totype;
		break;
	default:
		return;
	}
	Instruction *insn = allocate_instruction(proc, targetop, line_number);
	if (targetop == op_totype) {
		assert(vtype->type_name);
		const Constant *tname_constant = allocate_string_constant(proc, vtype->type_name);
		Pseudo *tname_pseudo = allocate_constant_pseudo(proc, tname_constant);
		add_instruction_operand(proc, insn, tname_pseudo);
	}
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
}